

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

uint64_t mse_4xh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  uint in_ECX;
  ulong in_RDX;
  ulong uVar15;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i v;
  __m128i sum_1x64;
  int i;
  __m256i square_result;
  __m256i zeros;
  __m256i sub_result;
  __m256i res1_4x64;
  __m256i res0_4x64;
  __m256i src_16x16;
  __m256i dst_16x16;
  __m256i src1_8x16;
  __m256i src0_8x16;
  __m128i src3_4x16;
  __m128i src2_4x16;
  __m128i src1_4x16;
  __m128i src0_4x16;
  __m128i dst_16x8;
  __m128i dst3_4x8;
  __m128i dst2_4x8;
  __m128i dst1_4x8;
  __m128i dst0_4x8;
  uint64_t sum;
  int local_644;
  undefined1 local_640 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 auStack_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  uint64_t local_488 [3];
  int local_46c;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  ulong local_420;
  undefined8 uStack_418;
  ulong *local_408;
  ulong local_400;
  undefined8 uStack_3f8;
  ulong *local_3e8;
  ulong local_3e0;
  undefined8 uStack_3d8;
  ulong *local_3c8;
  ulong local_3c0;
  undefined8 uStack_3b8;
  ulong *local_3a8;
  ulong local_3a0;
  undefined8 uStack_398;
  ulong local_390;
  undefined8 uStack_388;
  ulong local_380;
  undefined8 uStack_378;
  ulong local_370;
  undefined8 uStack_368;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  ulong local_290;
  undefined8 uStack_288;
  ulong local_280;
  undefined8 uStack_278;
  ulong local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  uint local_1c4;
  undefined1 local_1c0 [16];
  uint local_1a4;
  undefined1 local_1a0 [16];
  uint local_184;
  undefined1 local_180 [16];
  uint local_164;
  undefined1 local_160 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar14 = uStack_1f8;
  uVar13 = local_200;
  local_46c = (int)in_RSI;
  local_488[0] = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  local_220 = 0;
  uStack_218 = 0;
  local_640 = ZEXT1632(ZEXT816(0));
  local_644 = 0;
  uVar15 = in_RDX;
  while( true ) {
    if (in_R8D <= local_644) break;
    local_164 = *(uint *)(in_RDI + local_644 * local_46c);
    local_180._4_4_ = 0;
    local_180._0_4_ = local_164;
    local_184 = *(uint *)(in_RDI + (local_644 + 1) * local_46c);
    local_1a0._4_4_ = 0;
    local_1a0._0_4_ = local_184;
    local_1a4 = *(uint *)(in_RDI + (local_644 + 2) * local_46c);
    local_1c0._4_4_ = 0;
    local_1c0._0_4_ = local_1a4;
    local_1c4 = *(uint *)(in_RDI + (local_644 + 3) * local_46c);
    local_1e0._4_4_ = 0;
    local_1e0._0_4_ = local_1c4;
    local_270 = local_180._0_8_;
    uStack_268 = 0;
    local_280 = local_1a0._0_8_;
    uStack_278 = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_180._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_1a0._0_8_;
    local_350 = vpunpckldq_avx(auVar11,auVar10);
    local_290 = local_1c0._0_8_;
    uStack_288 = 0;
    local_2a0 = local_1e0._0_8_;
    uStack_298 = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1c0._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1e0._0_8_;
    local_360 = vpunpckldq_avx(auVar9,auVar8);
    auVar1 = vpunpcklqdq_avx(local_350,local_360);
    local_4e0 = auVar1._0_8_;
    local_2f0 = local_4e0;
    uStack_4d8 = auVar1._8_8_;
    uStack_2e8 = uStack_4d8;
    auVar2 = vpmovzxbw_avx2(auVar1);
    local_3a8 = (ulong *)(in_RDX + (long)(int)(local_644 * in_ECX) * 2);
    local_3c0 = *local_3a8;
    uStack_3b8 = 0;
    local_3c8 = (ulong *)(in_RDX + (long)(int)((local_644 + 1) * in_ECX) * 2);
    local_3e0 = *local_3c8;
    uStack_3d8 = 0;
    local_3e8 = (ulong *)(in_RDX + (long)(int)((local_644 + 2) * in_ECX) * 2);
    local_400 = *local_3e8;
    uStack_3f8 = 0;
    uVar15 = (ulong)in_ECX;
    local_408 = (ulong *)(in_RDX + (long)(int)((local_644 + 3) * in_ECX) * 2);
    local_420 = *local_408;
    uStack_418 = 0;
    uStack_368 = 0;
    uStack_378 = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_3c0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_3e0;
    local_330 = vpunpcklqdq_avx(auVar7,auVar6);
    uStack_388 = 0;
    uStack_398 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_400;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_420;
    local_340 = vpunpcklqdq_avx(auVar5,auVar1);
    auVar4._16_8_ = local_3e0;
    auVar4._0_16_ = local_330;
    auVar4._24_8_ = 0;
    auVar3._16_8_ = local_3e0;
    auVar3._0_16_ = local_340;
    auVar3._24_8_ = 0;
    auVar3 = vperm2i128_avx2(auVar4,auVar3,0x20);
    local_5a0 = auVar3._0_8_;
    local_240 = local_5a0;
    uStack_598 = auVar3._8_8_;
    uStack_238 = uStack_598;
    uStack_590 = auVar3._16_8_;
    uStack_230 = uStack_590;
    uStack_588 = auVar3._24_8_;
    uStack_228 = uStack_588;
    local_580 = auVar2._0_8_;
    local_260 = local_580;
    uStack_578 = auVar2._8_8_;
    uStack_258 = uStack_578;
    uStack_570 = auVar2._16_8_;
    uStack_250 = uStack_570;
    uStack_568 = auVar2._24_8_;
    uStack_248 = uStack_568;
    local_160 = vpsubw_avx2(auVar3,auVar2);
    auVar2 = vpabsw_avx2(local_160);
    local_600 = auVar2._0_8_;
    local_2c0 = local_600;
    uStack_5f8 = auVar2._8_8_;
    uStack_2b8 = uStack_5f8;
    uStack_5f0 = auVar2._16_8_;
    uStack_2b0 = uStack_5f0;
    uStack_5e8 = auVar2._24_8_;
    uStack_2a8 = uStack_5e8;
    local_2e0 = local_600;
    uStack_2d8 = uStack_5f8;
    uStack_2d0 = uStack_5f0;
    uStack_2c8 = uStack_5e8;
    auVar2 = vpmaddwd_avx2(auVar2,auVar2);
    local_440 = local_640._0_8_;
    uStack_438 = local_640._8_8_;
    uStack_430 = local_640._16_8_;
    uStack_428 = local_640._24_8_;
    local_5a0 = auVar2._0_8_;
    local_460 = local_5a0;
    uStack_598 = auVar2._8_8_;
    uStack_458 = uStack_598;
    uStack_590 = auVar2._16_8_;
    uStack_450 = uStack_590;
    uStack_588 = auVar2._24_8_;
    uStack_448 = uStack_588;
    local_640 = vpaddd_avx2(local_640,auVar2);
    local_644 = local_644 + 4;
    local_3a0 = local_420;
    local_390 = local_400;
    local_380 = local_3e0;
    local_370 = local_3c0;
    local_1e0 = ZEXT416(local_1c4);
    local_1c0 = ZEXT416(local_1a4);
    local_1a0 = ZEXT416(local_184);
    local_180 = ZEXT416(local_164);
  }
  local_120 = local_640._0_8_;
  uStack_118 = local_640._8_8_;
  uStack_110 = local_640._16_8_;
  uStack_108 = local_640._24_8_;
  auVar2._8_8_ = uVar14;
  auVar2._0_8_ = uVar13;
  auVar2._16_8_ = uVar13;
  auVar2._24_8_ = uVar14;
  auVar3 = vpunpckldq_avx2(local_640,auVar2);
  local_e0 = local_640._0_8_;
  uStack_d8 = local_640._8_8_;
  uStack_d0 = local_640._16_8_;
  uStack_c8 = local_640._24_8_;
  auVar12._8_8_ = uVar14;
  auVar12._0_8_ = uVar13;
  auVar12._16_8_ = uVar13;
  auVar12._24_8_ = uVar14;
  auVar2 = vpunpckhdq_avx2(local_640,auVar12);
  local_5c0 = auVar3._0_8_;
  uStack_5b8 = auVar3._8_8_;
  auStack_5b0._0_8_ = auVar3._16_8_;
  auStack_5b0._8_8_ = auVar3._24_8_;
  local_5e0 = auVar2._0_8_;
  uStack_5d8 = auVar2._8_8_;
  uStack_5d0 = auVar2._16_8_;
  uStack_5c8 = auVar2._24_8_;
  local_a0 = local_5c0;
  uStack_98 = uStack_5b8;
  uStack_90 = auStack_5b0._0_8_;
  uStack_88 = auStack_5b0._8_8_;
  local_c0 = local_5e0;
  uStack_b8 = uStack_5d8;
  uStack_b0 = uStack_5d0;
  uStack_a8 = uStack_5c8;
  auVar2 = vpaddq_avx2(auVar3,auVar2);
  local_5c0 = auVar2._0_8_;
  uStack_5b8 = auVar2._8_8_;
  auStack_5b0._0_8_ = auVar2._16_8_;
  auStack_5b0._8_8_ = auVar2._24_8_;
  local_320 = local_5c0;
  uStack_318 = uStack_5b8;
  uStack_310 = auStack_5b0._0_8_;
  uStack_308 = auStack_5b0._8_8_;
  uStack_38 = auStack_5b0._8_8_;
  local_40 = auStack_5b0._0_8_;
  auStack_5b0 = auVar2._16_16_;
  local_60 = vpaddq_avx(auStack_5b0,local_50);
  local_70 = vpsrldq_avx(local_60,8);
  vpaddq_avx(local_60,local_70);
  v[1] = uVar15;
  v[0] = in_RSI;
  xx_storel_64(local_488,v);
  return local_488[0];
}

Assistant:

static uint64_t mse_4xh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                   int sstride, int h) {
  uint64_t sum = 0;
  __m128i dst0_4x8, dst1_4x8, dst2_4x8, dst3_4x8, dst_16x8;
  __m128i src0_4x16, src1_4x16, src2_4x16, src3_4x16;
  __m256i src0_8x16, src1_8x16, dst_16x16, src_16x16;
  __m256i res0_4x64, res1_4x64;
  __m256i sub_result;
  const __m256i zeros = _mm256_broadcastsi128_si256(_mm_setzero_si128());
  __m256i square_result = _mm256_broadcastsi128_si256(_mm_setzero_si128());
  for (int i = 0; i < h; i += 4) {
    dst0_4x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 0) * dstride]));
    dst1_4x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 1) * dstride]));
    dst2_4x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 2) * dstride]));
    dst3_4x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 3) * dstride]));
    dst_16x8 = _mm_unpacklo_epi64(_mm_unpacklo_epi32(dst0_4x8, dst1_4x8),
                                  _mm_unpacklo_epi32(dst2_4x8, dst3_4x8));
    dst_16x16 = _mm256_cvtepu8_epi16(dst_16x8);

    src0_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 0) * sstride]));
    src1_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 1) * sstride]));
    src2_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 2) * sstride]));
    src3_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 3) * sstride]));
    src0_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(src0_4x16, src1_4x16));
    src1_8x16 =
        _mm256_castsi128_si256(_mm_unpacklo_epi64(src2_4x16, src3_4x16));
    src_16x16 = _mm256_permute2x128_si256(src0_8x16, src1_8x16, 0x20);

    // r15 r14 r13------------r1 r0  - 16 bit
    sub_result = _mm256_abs_epi16(_mm256_sub_epi16(src_16x16, dst_16x16));

    // s7 s6 s5 s4 s3 s2 s1 s0 - 32bit
    src_16x16 = _mm256_madd_epi16(sub_result, sub_result);

    // accumulation of result
    square_result = _mm256_add_epi32(square_result, src_16x16);
  }

  // s5 s4 s1 s0  - 64bit
  res0_4x64 = _mm256_unpacklo_epi32(square_result, zeros);
  // s7 s6 s3 s2 - 64bit
  res1_4x64 = _mm256_unpackhi_epi32(square_result, zeros);
  // r3 r2 r1 r0 - 64bit
  res0_4x64 = _mm256_add_epi64(res0_4x64, res1_4x64);
  // r1+r3 r2+r0 - 64bit
  const __m128i sum_1x64 =
      _mm_add_epi64(_mm256_castsi256_si128(res0_4x64),
                    _mm256_extracti128_si256(res0_4x64, 1));
  xx_storel_64(&sum, _mm_add_epi64(sum_1x64, _mm_srli_si128(sum_1x64, 8)));
  return sum;
}